

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzintrulelist.cpp
# Opt level: O2

void __thiscall TPZIntRuleList::~TPZIntRuleList(TPZIntRuleList *this)

{
  TPZGaussRule *this_00;
  TPZIntRuleT *this_01;
  TPZIntRuleT3D *this_02;
  TPZIntRuleP3D *this_03;
  long lVar1;
  
  for (lVar1 = 0; lVar1 < (this->fintlist).fNElements; lVar1 = lVar1 + 1) {
    this_00 = (this->fintlist).fStore[lVar1];
    if (this_00 != (TPZGaussRule *)0x0) {
      TPZGaussRule::~TPZGaussRule(this_00);
      operator_delete(this_00,0x80);
    }
  }
  TPZVec<TPZGaussRule_*>::Resize(&this->fintlist,0);
  for (lVar1 = 0; lVar1 < (this->fintlistT).fNElements; lVar1 = lVar1 + 1) {
    this_01 = (this->fintlistT).fStore[lVar1];
    if (this_01 != (TPZIntRuleT *)0x0) {
      TPZIntRuleT::~TPZIntRuleT(this_01);
      operator_delete(this_01,0x260);
    }
  }
  TPZVec<TPZIntRuleT_*>::Resize(&this->fintlistT,0);
  for (lVar1 = 0; lVar1 < (this->fintlistT3D).fNElements; lVar1 = lVar1 + 1) {
    this_02 = (this->fintlistT3D).fStore[lVar1];
    if (this_02 != (TPZIntRuleT3D *)0x0) {
      TPZIntRuleT3D::~TPZIntRuleT3D(this_02);
      operator_delete(this_02,800);
    }
  }
  TPZVec<TPZIntRuleT3D_*>::Resize(&this->fintlistT3D,0);
  for (lVar1 = 0; lVar1 < (this->fintlistP3D).fNElements; lVar1 = lVar1 + 1) {
    this_03 = (this->fintlistP3D).fStore[lVar1];
    if (this_03 != (TPZIntRuleP3D *)0x0) {
      TPZIntRuleP3D::~TPZIntRuleP3D(this_03);
      operator_delete(this_03,0x90);
    }
  }
  TPZVec<TPZIntRuleP3D_*>::Resize(&this->fintlistP3D,0);
  TPZVec<TPZIntRuleP3D_*>::~TPZVec(&this->fintlistP3D);
  TPZVec<TPZIntRuleT3D_*>::~TPZVec(&this->fintlistT3D);
  TPZVec<TPZIntRuleT_*>::~TPZVec(&this->fintlistT);
  TPZVec<TPZGaussRule_*>::~TPZVec(&this->fintlist);
  return;
}

Assistant:

TPZIntRuleList::~TPZIntRuleList() {
	int i;
	/** Deleting dinamic allocation of the Gauss integration rules at the vector */
	for(i=0 ; i<fintlist.NElements() ; i++)   if (fintlist[i])   delete fintlist[i];
	fintlist.Resize(0);
	/** Deleting dinamic allocation of the cubature rules for triangle at the vector */
	for(i=0 ; i<fintlistT.NElements() ; i++)   if (fintlistT[i])   delete fintlistT[i];
	fintlistT.Resize(0);
	/** Deleting dinamic allocation of the cubature rules for tetrahedra at the vector */
	for(i=0 ; i<fintlistT3D.NElements() ; i++)   if (fintlistT3D[i])   delete fintlistT3D[i];
	fintlistT3D.Resize(0);
	
	/** Deleting dinamic allocation of the cubature rules for pyramid at the vector */
	for(i=0 ; i<fintlistP3D.NElements() ; i++)   if (fintlistP3D[i])   delete fintlistP3D[i];
	fintlistP3D.Resize(0);
}